

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *psVar1;
  secp256k1_fe *a_00;
  int iVar2;
  long lVar3;
  secp256k1_fe local_238;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe z22;
  secp256k1_fe local_188;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe local_108;
  secp256k1_fe s2;
  secp256k1_fe t;
  secp256k1_fe h2;
  secp256k1_fe i2;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      r->infinity = 0;
      psVar1 = &b->z;
      secp256k1_fe_sqr(&z22,psVar1);
      a_00 = &a->z;
      secp256k1_fe_sqr(&z12,a_00);
      secp256k1_fe_mul(&u1,&a->x,&z22);
      secp256k1_fe_mul(&u2,&b->x,&z12);
      secp256k1_fe_mul(&s1,&a->y,&z22);
      secp256k1_fe_mul(&s1,&s1,psVar1);
      secp256k1_fe_mul(&s2,&b->y,&z12);
      secp256k1_fe_mul(&s2,&s2,a_00);
      local_188.n[0] = (u2.n[0] - u1.n[0]) + 0x3ffffbfffff0bc;
      local_188.n[1] = (u2.n[1] - u1.n[1]) + 0x3ffffffffffffc;
      local_188.n[2] = (u2.n[2] - u1.n[2]) + 0x3ffffffffffffc;
      local_188.n[3] = (u2.n[3] - u1.n[3]) + 0x3ffffffffffffc;
      local_188.n[4] = (u2.n[4] - u1.n[4]) + 0x3fffffffffffc;
      local_238.n[0] = (s2.n[0] - s1.n[0]) + 0x3ffffbfffff0bc;
      local_238.n[1] = (s2.n[1] - s1.n[1]) + 0x3ffffffffffffc;
      local_238.n[2] = (s2.n[2] - s1.n[2]) + 0x3ffffffffffffc;
      local_238.n[3] = (s2.n[3] - s1.n[3]) + 0x3ffffffffffffc;
      local_238.n[4] = (s2.n[4] - s1.n[4]) + 0x3fffffffffffc;
      iVar2 = secp256k1_fe_normalizes_to_zero_var(&local_188);
      if (iVar2 == 0) {
        secp256k1_fe_sqr(&i2,&local_238);
        secp256k1_fe_sqr(&h2,&local_188);
        secp256k1_fe_mul(&local_108,&local_188,&h2);
        secp256k1_fe_mul(&local_188,&local_188,psVar1);
        secp256k1_fe_mul(&r->z,a_00,&local_188);
        secp256k1_fe_mul(&t,&u1,&h2);
        (r->x).n[4] = t.n[4];
        (r->x).n[2] = t.n[2];
        (r->x).n[3] = t.n[3];
        (r->x).n[0] = t.n[0];
        (r->x).n[1] = t.n[1];
        secp256k1_fe_mul_int(&r->x,2);
        secp256k1_fe_add(&r->x,&local_108);
        secp256k1_fe_negate(&r->x,&r->x,3);
        secp256k1_fe_add(&r->x,&i2);
        psVar1 = &r->y;
        secp256k1_fe_negate(psVar1,&r->x,5);
        secp256k1_fe_add(psVar1,&t);
        secp256k1_fe_mul(psVar1,psVar1,&local_238);
        secp256k1_fe_mul(&local_108,&local_108,&s1);
        local_108.n[0] = 0x3ffffbfffff0bc - local_108.n[0];
        local_108.n[1] = 0x3ffffffffffffc - local_108.n[1];
        local_108.n[2] = 0x3ffffffffffffc - local_108.n[2];
        local_108.n[3] = 0x3ffffffffffffc - local_108.n[3];
        local_108.n[4] = 0x3fffffffffffc - local_108.n[4];
        secp256k1_fe_add(psVar1,&local_108);
        return;
      }
      iVar2 = secp256k1_fe_normalizes_to_zero_var(&local_238);
      if (iVar2 == 0) {
        r->infinity = 1;
        return;
      }
      secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
      return;
    }
    lVar3 = 0x10;
  }
  else {
    lVar3 = 0x10;
    a = b;
  }
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (r->x).n[0] = (a->x).n[0];
    a = (secp256k1_gej *)((a->x).n + 1);
    r = (secp256k1_gej *)((r->x).n + 1);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* Operations: 12 mul, 4 sqr, 2 normalize, 12 mul_int/add/negate */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, i2, h2, h3, t;

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }

    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    r->infinity = 0;
    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s1, 1); secp256k1_fe_add(&i, &s2);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            r->infinity = 1;
        }
        return;
    }
    secp256k1_fe_sqr(&i2, &i);
    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_mul(&h3, &h, &h2);
    secp256k1_fe_mul(&h, &h, &b->z);
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);
    secp256k1_fe_mul(&t, &u1, &h2);
    r->x = t; secp256k1_fe_mul_int(&r->x, 2); secp256k1_fe_add(&r->x, &h3); secp256k1_fe_negate(&r->x, &r->x, 3); secp256k1_fe_add(&r->x, &i2);
    secp256k1_fe_negate(&r->y, &r->x, 5); secp256k1_fe_add(&r->y, &t); secp256k1_fe_mul(&r->y, &r->y, &i);
    secp256k1_fe_mul(&h3, &h3, &s1); secp256k1_fe_negate(&h3, &h3, 1);
    secp256k1_fe_add(&r->y, &h3);
}